

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

void __thiscall
spvtools::disassemble::InstructionDisassembler::EmitSectionComment
          (InstructionDisassembler *this,spv_parsed_instruction_t *inst,
          bool *inserted_decoration_space,bool *inserted_debug_space,bool *inserted_type_space)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  ostream *poVar5;
  Op opcode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  bool *local_38;
  
  uVar1 = inst->opcode;
  iVar3 = this->comment_;
  if (uVar1 == 0x36 && iVar3 != 0) {
    local_38 = inserted_type_space;
    std::endl<char,std::char_traits<char>>(this->stream_);
    if (this->nested_indent_ == true) {
      std::endl<char,std::char_traits<char>>(this->stream_);
    }
    poVar5 = this->stream_;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_58,(char)this->indent_);
    std::operator<<(poVar5,(string *)&local_58);
    std::__cxx11::string::_M_dispose();
    poVar5 = std::operator<<(this->stream_,"; Function ");
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
    ::operator()(&local_58,&this->name_mapper_,inst->result_id);
    poVar5 = std::operator<<(poVar5,(string *)&local_58);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::_M_dispose();
    iVar3 = this->comment_;
    inserted_type_space = local_38;
  }
  opcode = (Op)uVar1;
  if (((iVar3 != 0) && (*inserted_decoration_space == false)) &&
     (bVar2 = spvOpcodeIsDecoration(opcode), bVar2)) {
    *inserted_decoration_space = true;
    std::endl<char,std::char_traits<char>>(this->stream_);
    poVar5 = this->stream_;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_58,(char)this->indent_);
    std::operator<<(poVar5,(string *)&local_58);
    std::__cxx11::string::_M_dispose();
    poVar5 = std::operator<<(this->stream_,"; Annotations");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  if (this->comment_ != 0) {
    if (*inserted_debug_space == false) {
      bVar2 = spvOpcodeIsDebug(opcode);
      if (bVar2) {
        *inserted_debug_space = true;
        std::endl<char,std::char_traits<char>>(this->stream_);
        poVar5 = this->stream_;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_58,(char)this->indent_);
        std::operator<<(poVar5,(string *)&local_58);
        std::__cxx11::string::_M_dispose();
        poVar5 = std::operator<<(this->stream_,"; Debug Information");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      if (this->comment_ == 0) {
        return;
      }
    }
    if ((*inserted_type_space == false) && (iVar4 = spvOpcodeGeneratesType(opcode), iVar4 != 0)) {
      *inserted_type_space = true;
      std::endl<char,std::char_traits<char>>(this->stream_);
      poVar5 = this->stream_;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_58,(char)this->indent_);
      std::operator<<(poVar5,(string *)&local_58);
      std::__cxx11::string::_M_dispose();
      poVar5 = std::operator<<(this->stream_,"; Types, variables and constants");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  return;
}

Assistant:

void InstructionDisassembler::EmitSectionComment(
    const spv_parsed_instruction_t& inst, bool& inserted_decoration_space,
    bool& inserted_debug_space, bool& inserted_type_space) {
  auto opcode = static_cast<spv::Op>(inst.opcode);
  if (comment_ && opcode == spv::Op::OpFunction) {
    stream_ << std::endl;
    if (nested_indent_) {
      // Double the empty lines between Function sections since nested_indent_
      // also separates blocks by a blank.
      stream_ << std::endl;
    }
    stream_ << std::string(indent_, ' ');
    stream_ << "; Function " << name_mapper_(inst.result_id) << std::endl;
  }
  if (comment_ && !inserted_decoration_space && spvOpcodeIsDecoration(opcode)) {
    inserted_decoration_space = true;
    stream_ << std::endl;
    stream_ << std::string(indent_, ' ');
    stream_ << "; Annotations" << std::endl;
  }
  if (comment_ && !inserted_debug_space && spvOpcodeIsDebug(opcode)) {
    inserted_debug_space = true;
    stream_ << std::endl;
    stream_ << std::string(indent_, ' ');
    stream_ << "; Debug Information" << std::endl;
  }
  if (comment_ && !inserted_type_space && spvOpcodeGeneratesType(opcode)) {
    inserted_type_space = true;
    stream_ << std::endl;
    stream_ << std::string(indent_, ' ');
    stream_ << "; Types, variables and constants" << std::endl;
  }
}